

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_field.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::objectivec::FieldGeneratorMap::DoesAnyFieldHaveNonZeroDefault
          (FieldGeneratorMap *this)

{
  bool bVar1;
  int iVar2;
  FieldDescriptor *field;
  int local_1c;
  int i;
  FieldGeneratorMap *this_local;
  
  local_1c = 0;
  while( true ) {
    iVar2 = Descriptor::field_count(this->descriptor_);
    if (iVar2 <= local_1c) {
      return false;
    }
    field = Descriptor::field(this->descriptor_,local_1c);
    bVar1 = HasNonZeroDefaultValue(field);
    if (bVar1) break;
    local_1c = local_1c + 1;
  }
  return true;
}

Assistant:

bool FieldGeneratorMap::DoesAnyFieldHaveNonZeroDefault(void) const {
  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (HasNonZeroDefaultValue(descriptor_->field(i))) {
      return true;
    }
  }

  return false;
}